

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O0

ValueT * Qentem::JSON::JSONParser<char,_Qentem::StringStream<char>_>::parseArray
                   (ValueT *__return_storage_ptr__,StringStream<char> *stream,char *content,
                   SizeT *offset,SizeT length)

{
  undefined1 local_50 [7];
  char ch;
  ArrayT *local_38;
  Array<Qentem::Value<char>_> *arr;
  SizeT *pSStack_28;
  SizeT length_local;
  SizeT *offset_local;
  char *content_local;
  StringStream<char> *stream_local;
  ValueT *value;
  
  arr._4_4_ = length;
  pSStack_28 = offset;
  offset_local = (SizeT *)content;
  content_local = (char *)stream;
  stream_local = (StringStream<char> *)__return_storage_ptr__;
  StringUtils::TrimLeft<char,unsigned_int>(content,offset,length);
  arr._3_1_ = 0;
  Value<char>::Value(__return_storage_ptr__,Array);
  if (*(char *)((long)offset_local + (ulong)*pSStack_28) != ']') {
    local_38 = Value<char>::GetArray(__return_storage_ptr__);
    while (*pSStack_28 < arr._4_4_) {
      parseValue((ValueT *)local_50,(StringStream<char> *)content_local,(char *)offset_local,
                 pSStack_28,arr._4_4_);
      Array<Qentem::Value<char>_>::operator+=(local_38,(Value<char> *)local_50);
      Value<char>::~Value((Value<char> *)local_50);
      StringUtils::TrimLeft<char,unsigned_int>((char *)offset_local,pSStack_28,arr._4_4_);
      if (arr._4_4_ <= *pSStack_28) break;
      if (*(char *)((long)offset_local + (ulong)*pSStack_28) != ',') {
        if (*(char *)((long)offset_local + (ulong)*pSStack_28) == ']') {
          *pSStack_28 = *pSStack_28 + 1;
          return __return_storage_ptr__;
        }
        break;
      }
      *pSStack_28 = *pSStack_28 + 1;
      StringUtils::TrimLeft<char,unsigned_int>((char *)offset_local,pSStack_28,arr._4_4_);
    }
    Value<char>::Reset(__return_storage_ptr__);
  }
  *pSStack_28 = *pSStack_28 + 1;
  return __return_storage_ptr__;
}

Assistant:

static ValueT parseArray(Stream_T &stream, const Char_T *content, SizeT &offset, const SizeT length) {
            StringUtils::TrimLeft(content, offset, length);

            ValueT value{ValueType::Array};

            if (content[offset] != JSONotation::ESquareChar) {
                Array<ValueT> *arr = value.GetArray();

                while (offset < length) {
                    *arr += parseValue(stream, content, offset, length);
                    StringUtils::TrimLeft(content, offset, length);

                    if (offset < length) {
                        const Char_T ch = content[offset];

                        if (ch == JSONotation::CommaChar) {
                            ++offset;
                            StringUtils::TrimLeft(content, offset, length);
                            continue;
                        }

                        if (ch == JSONotation::ESquareChar) {
                            ++offset;
                            return value;
                        }
                    }

                    break;
                }

                value.Reset();
            }

            ++offset;
            return value;
        }